

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O1

Reference<std::allocator<absl::lts_20250127::status_internal::Payload>_> __thiscall
absl::lts_20250127::inlined_vector_internal::
Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
::EmplaceBackSlow<absl::lts_20250127::status_internal::Payload>
          (Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
           *this,Payload *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  pointer pcVar3;
  undefined8 uVar4;
  CordRep *pCVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  move_iterator<absl::lts_20250127::status_internal::Payload_*> mVar7;
  Payload *__p;
  size_type __n;
  Payload *pPVar8;
  SizeType<std::allocator<absl::lts_20250127::status_internal::Payload>_> i;
  ulong construct_size;
  bool bVar9;
  AllocationTransaction<std::allocator<absl::lts_20250127::status_internal::Payload>_> allocation_tx
  ;
  IteratorValueAdapter<std::allocator<absl::lts_20250127::status_internal::Payload>,_std::move_iterator<absl::lts_20250127::status_internal::Payload_*>_>
  move_values;
  Payload *local_58;
  SizeType<std::allocator<absl::lts_20250127::status_internal::Payload>_> SStack_50;
  ulong local_40;
  IteratorValueAdapter<std::allocator<absl::lts_20250127::status_internal::Payload>,_std::move_iterator<absl::lts_20250127::status_internal::Payload_*>_>
  local_38;
  
  uVar2 = (this->metadata_).
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
          .super_Storage<unsigned_long,_1UL,_false>.value;
  bVar9 = (uVar2 & 1) != 0;
  mVar7._M_current = (Payload *)&this->data_;
  if (bVar9) {
    mVar7._M_current = (this->data_).allocated.allocated_data;
  }
  local_58 = (Payload *)0x0;
  SStack_50 = 0;
  __n = 2;
  if (bVar9) {
    __n = (this->data_).allocated.allocated_capacity * 2;
  }
  local_38.it_._M_current =
       (move_iterator<absl::lts_20250127::status_internal::Payload_*>)
       (move_iterator<absl::lts_20250127::status_internal::Payload_*>)mVar7._M_current;
  local_58 = __gnu_cxx::new_allocator<absl::lts_20250127::status_internal::Payload>::allocate
                       ((new_allocator<absl::lts_20250127::status_internal::Payload> *)&local_58,__n
                        ,(void *)0x0);
  construct_size = uVar2 >> 1;
  paVar6 = &local_58[construct_size].type_url.field_2;
  pPVar8 = local_58 + construct_size;
  local_58[construct_size].type_url._M_dataplus._M_p = (pointer)paVar6;
  pcVar3 = (args->type_url)._M_dataplus._M_p;
  paVar1 = &(args->type_url).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar4 = *(undefined8 *)((long)&(args->type_url).field_2 + 8);
    paVar6->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&local_58[construct_size].type_url.field_2 + 8) = uVar4;
  }
  else {
    (pPVar8->type_url)._M_dataplus._M_p = pcVar3;
    (pPVar8->type_url).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (pPVar8->type_url)._M_string_length = (args->type_url)._M_string_length;
  (args->type_url)._M_dataplus._M_p = (pointer)paVar1;
  (args->type_url)._M_string_length = 0;
  (args->type_url).field_2._M_local_buf[0] = '\0';
  pCVar5 = (args->payload).contents_.data_.rep_.field_0.as_tree.rep;
  (pPVar8->payload).contents_.data_.rep_.field_0.as_tree.cordz_info =
       (args->payload).contents_.data_.rep_.field_0.as_tree.cordz_info;
  (pPVar8->payload).contents_.data_.rep_.field_0.as_tree.rep = pCVar5;
  (args->payload).contents_.data_.rep_.field_0.as_tree.cordz_info = 0;
  (args->payload).contents_.data_.rep_.field_0.as_tree.rep = (CordRep *)0x0;
  SStack_50 = __n;
  local_40 = uVar2;
  ConstructElements<std::allocator<absl::lts_20250127::status_internal::Payload>,absl::lts_20250127::inlined_vector_internal::IteratorValueAdapter<std::allocator<absl::lts_20250127::status_internal::Payload>,std::move_iterator<absl::lts_20250127::status_internal::Payload*>>>
            ((type_identity_t<std::allocator<absl::lts_20250127::status_internal::Payload>_> *)this,
             local_58,&local_38,construct_size);
  if (1 < local_40) {
    __p = mVar7._M_current + (construct_size - 1);
    do {
      __gnu_cxx::new_allocator<absl::lts_20250127::status_internal::Payload>::
      destroy<absl::lts_20250127::status_internal::Payload>
                ((new_allocator<absl::lts_20250127::status_internal::Payload> *)this,__p);
      __p = __p + -1;
      construct_size = construct_size - 1;
    } while (construct_size != 0);
  }
  if (((this->metadata_).
       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
       .super_Storage<unsigned_long,_1UL,_false>.value & 1) != 0) {
    operator_delete((this->data_).allocated.allocated_data,
                    (this->data_).allocated.allocated_capacity * 0x30);
  }
  (this->data_).allocated.allocated_data = local_58;
  (this->data_).allocated.allocated_capacity = SStack_50;
  (this->metadata_).
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
  .super_Storage<unsigned_long,_1UL,_false>.value =
       ((this->metadata_).
        super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
        .super_Storage<unsigned_long,_1UL,_false>.value | 1) + 2;
  return pPVar8;
}

Assistant:

auto Storage<T, N, A>::EmplaceBackSlow(Args&&... args) -> Reference<A> {
  StorageView<A> storage_view = MakeStorageView();
  AllocationTransaction<A> allocation_tx(GetAllocator());
  IteratorValueAdapter<A, MoveIterator<A>> move_values(
      MoveIterator<A>(storage_view.data));
  SizeType<A> requested_capacity = NextCapacity(storage_view.capacity);
  Pointer<A> construct_data = allocation_tx.Allocate(requested_capacity);
  Pointer<A> last_ptr = construct_data + storage_view.size;

  // Construct new element.
  AllocatorTraits<A>::construct(GetAllocator(), last_ptr,
                                std::forward<Args>(args)...);
  // Move elements from old backing store to new backing store.
  ABSL_INTERNAL_TRY {
    ConstructElements<A>(GetAllocator(), allocation_tx.GetData(), move_values,
                         storage_view.size);
  }